

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

void FT_Vector_Polarize(FT_Vector *vec,FT_Fixed *length,FT_Angle *angle)

{
  FT_Fixed FVar1;
  ulong local_40;
  undefined1 local_38 [8];
  FT_Vector v;
  FT_Int shift;
  FT_Angle *angle_local;
  FT_Fixed *length_local;
  FT_Vector *vec_local;
  
  if (((vec != (FT_Vector *)0x0) && (length != (FT_Fixed *)0x0)) && (angle != (FT_Angle *)0x0)) {
    local_38 = (undefined1  [8])vec->x;
    v.x = vec->y;
    if ((local_38 != (undefined1  [8])0x0) || (v.x != 0)) {
      v.y._4_4_ = ft_trig_prenorm((FT_Vector *)local_38);
      ft_trig_pseudo_polarize((FT_Vector *)local_38);
      FVar1 = ft_trig_downscale((FT_Fixed)local_38);
      if (v.y._4_4_ < 0) {
        local_40 = (ulong)(uint)((int)FVar1 << (-(byte)v.y._4_4_ & 0x1f));
      }
      else {
        local_40 = FVar1 >> ((byte)v.y._4_4_ & 0x3f);
      }
      *length = local_40;
      *angle = v.x;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Polarize( FT_Vector*  vec,
                      FT_Fixed   *length,
                      FT_Angle   *angle )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec || !length || !angle )
      return;

    v = *vec;

    if ( v.x == 0 && v.y == 0 )
      return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    v.x = ft_trig_downscale( v.x );

    *length = shift >= 0 ?                      ( v.x >>  shift )
                         : (FT_Fixed)( (FT_UInt32)v.x << -shift );
    *angle  = v.y;
  }